

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *node,Reader *replacement)

{
  short sVar1;
  uint uVar2;
  void *pvVar3;
  undefined4 uVar4;
  Which WVar5;
  Which WVar6;
  uint64_t scopeId;
  uint64_t replacementScopeId;
  DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which> _kjCondition;
  Fault f;
  uint uStack_40;
  
  if ((node->_reader).dataSize < 0x70) {
    WVar5 = FILE;
  }
  else {
    WVar5 = *(Which *)((long)(node->_reader).data + 0xc);
  }
  if ((replacement->_reader).dataSize < 0x70) {
    WVar6 = FILE;
  }
  else {
    WVar6 = *(Which *)((long)(replacement->_reader).data + 0xc);
  }
  _kjCondition.right = WVar6;
  _kjCondition.left = WVar5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = WVar5 == WVar6;
  if (WVar5 == WVar6) {
    capnp::schema::Node::Reader::getParameters((Reader *)&_kjCondition,replacement);
    uVar4 = _kjCondition._24_4_;
    capnp::schema::Node::Reader::getParameters((Reader *)&f,node);
    if (uStack_40 < (uint)uVar4) {
      replacementIsNewer(this);
    }
    else {
      capnp::schema::Node::Reader::getParameters((Reader *)&_kjCondition,replacement);
      uVar4 = _kjCondition._24_4_;
      capnp::schema::Node::Reader::getParameters((Reader *)&f,node);
      if ((uint)uVar4 < uStack_40) {
        replacementIsOlder(this);
      }
    }
    uVar2 = (node->_reader).dataSize;
    if (0x6f < uVar2) {
      pvVar3 = (node->_reader).data;
      sVar1 = *(short *)((long)pvVar3 + 0xc);
      if (sVar1 == 3) {
        _kjCondition._0_8_ = (node->_reader).segment;
        _kjCondition.op.content.ptr = (char *)(node->_reader).capTable;
        _kjCondition.op.content.size_ = (size_t)(node->_reader).data;
        _kjCondition._24_8_ = (node->_reader).pointers;
        f.exception = (Exception *)(replacement->_reader).segment;
        checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f);
      }
      else if (sVar1 == 2) {
        _kjCondition._0_8_ = (node->_reader).segment;
        _kjCondition.op.content.ptr = (char *)(node->_reader).capTable;
        _kjCondition.op.content.size_ = (size_t)(node->_reader).data;
        _kjCondition._24_8_ = (node->_reader).pointers;
        f.exception = (Exception *)(replacement->_reader).segment;
        checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f);
      }
      else if (sVar1 == 1) {
        _kjCondition._0_8_ = (node->_reader).segment;
        _kjCondition.op.content.ptr = (char *)(node->_reader).capTable;
        _kjCondition.op.content.size_ = (size_t)(node->_reader).data;
        _kjCondition._24_8_ = (node->_reader).pointers;
        f.exception = (Exception *)(replacement->_reader).segment;
        if (uVar2 < 0xc0) {
          scopeId = 0;
        }
        else {
          scopeId = *(uint64_t *)((long)pvVar3 + 0x10);
        }
        if ((replacement->_reader).dataSize < 0xc0) {
          replacementScopeId = 0;
        }
        else {
          replacementScopeId = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
        }
        checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f,scopeId,replacementScopeId);
      }
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which>&,char_const(&)[28]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x2c1,FAILED,"node.which() == replacement.which()",
               "_kjCondition,\"kind of declaration changed\"",&_kjCondition,
               (char (*) [28])"kind of declaration changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Reader& node,
                          const schema::Node::Reader& replacement) {
    // Returns whether `replacement` is equivalent, older than, newer than, or incompatible with
    // `node`.  If exceptions are enabled, this will throw an exception on INCOMPATIBLE.

    VALIDATE_SCHEMA(node.which() == replacement.which(),
                    "kind of declaration changed");

    // No need to check compatibility of most of the non-body parts of the node:
    // - Arbitrary renaming and moving between scopes is allowed.
    // - Annotations are ignored for compatibility purposes.

    if (replacement.getParameters().size() > node.getParameters().size()) {
      replacementIsNewer();
    } else if (replacement.getParameters().size() < node.getParameters().size()) {
      replacementIsOlder();
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        checkCompatibility(node.getStruct(), replacement.getStruct(),
                           node.getScopeId(), replacement.getScopeId());
        break;
      case schema::Node::ENUM:
        checkCompatibility(node.getEnum(), replacement.getEnum());
        break;
      case schema::Node::INTERFACE:
        checkCompatibility(node.getInterface(), replacement.getInterface());
        break;
      case schema::Node::CONST:
        checkCompatibility(node.getConst(), replacement.getConst());
        break;
      case schema::Node::ANNOTATION:
        checkCompatibility(node.getAnnotation(), replacement.getAnnotation());
        break;
    }
  }